

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O0

void __thiscall script_tests::sign_paytoanchor::test_method(sign_paytoanchor *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  CMutableTransaction curr;
  CMutableTransaction prev;
  SignatureData sig_data;
  FillableSigningProvider keystore;
  SignatureData *in_stack_fffffffffffff928;
  undefined7 in_stack_fffffffffffff930;
  undefined1 in_stack_fffffffffffff937;
  COutPoint *in_stack_fffffffffffff938;
  undefined7 in_stack_fffffffffffff940;
  undefined1 in_stack_fffffffffffff947;
  CMutableTransaction *in_stack_fffffffffffff948;
  undefined7 in_stack_fffffffffffff950;
  undefined1 in_stack_fffffffffffff957;
  SignatureData *sig_data_00;
  CMutableTransaction *tx;
  CTransaction *this_00;
  CTransaction *txFrom;
  SigningProvider *in_stack_fffffffffffff978;
  PayToAnchor *in_stack_fffffffffffff980;
  const_string local_670 [2];
  SignatureData *in_stack_fffffffffffff9b8;
  assertion_result local_630 [3];
  undefined4 local_5d4;
  CTransaction local_498 [9];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  FillableSigningProvider::FillableSigningProvider
            ((FillableSigningProvider *)in_stack_fffffffffffff928);
  SignatureData::SignatureData(in_stack_fffffffffffff9b8);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff928);
  CMutableTransaction::CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff928);
  txFrom = (CTransaction *)&stack0xfffffffffffffa80;
  local_5d4 = 0;
  PayToAnchor::PayToAnchor(in_stack_fffffffffffff980);
  this_00 = local_498;
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<PayToAnchor,void,void,PayToAnchor,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff938,
             (PayToAnchor *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930));
  GetScriptForDestination((CTxDestination *)in_stack_fffffffffffff928);
  std::vector<CTxOut,std::allocator<CTxOut>>::emplace_back<int,CScript>
            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffff948,
             (int *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940),
             (CScript *)in_stack_fffffffffffff938);
  CScript::~CScript((CScript *)in_stack_fffffffffffff928);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff928);
  PayToAnchor::~PayToAnchor((PayToAnchor *)in_stack_fffffffffffff928);
  tx = (CMutableTransaction *)&stack0xfffffffffffffa30;
  CMutableTransaction::GetHash(in_stack_fffffffffffff948);
  COutPoint::COutPoint
            (in_stack_fffffffffffff938,
             (Txid *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
             (uint32_t)((ulong)in_stack_fffffffffffff928 >> 0x20));
  std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<COutPoint>
            (&in_stack_fffffffffffff948->vin,
             (COutPoint *)CONCAT17(in_stack_fffffffffffff947,in_stack_fffffffffffff940));
  do {
    sig_data_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)this_00,(const_string *)tx,(size_t)sig_data_00,
               (const_string *)CONCAT17(in_stack_fffffffffffff957,in_stack_fffffffffffff950));
    CTransaction::CTransaction(this_00,tx);
    in_stack_fffffffffffff957 =
         SignSignature(in_stack_fffffffffffff978,txFrom,(CMutableTransaction *)this_00,
                       (uint)((ulong)tx >> 0x20),(int)tx,sig_data_00);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffff938,(bool)in_stack_fffffffffffff937);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (unsigned_long)in_stack_fffffffffffff928);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (basic_cstring<const_char> *)in_stack_fffffffffffff928);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff938,
               (pointer)CONCAT17(in_stack_fffffffffffff937,in_stack_fffffffffffff930),
               (unsigned_long)in_stack_fffffffffffff928);
    in_stack_fffffffffffff928 = (SignatureData *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_630,(lazy_ostream *)&stack0xfffffffffffff9b0,local_670,0x50e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_fffffffffffff928);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffff928);
    CTransaction::~CTransaction((CTransaction *)in_stack_fffffffffffff928);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff928);
  CMutableTransaction::~CMutableTransaction((CMutableTransaction *)in_stack_fffffffffffff928);
  SignatureData::~SignatureData(in_stack_fffffffffffff928);
  FillableSigningProvider::~FillableSigningProvider
            ((FillableSigningProvider *)in_stack_fffffffffffff928);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(sign_paytoanchor)
{
    FillableSigningProvider keystore;
    SignatureData sig_data;
    CMutableTransaction prev, curr;
    prev.vout.emplace_back(0, GetScriptForDestination(PayToAnchor{}));

    curr.vin.emplace_back(COutPoint{prev.GetHash(), 0});

    BOOST_CHECK(SignSignature(keystore, CTransaction(prev), curr, 0, SIGHASH_ALL, sig_data));
}